

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma.c
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  FILE *__stream;
  rnndb *db;
  char *pcVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  obj obj [256];
  state s;
  char *local_f118;
  _func__Bool_state_ptr *local_f110;
  rnndeccolors *local_f108;
  code *local_f100;
  uint32_t auStack_f0f8 [1536];
  state local_d8f8;
  
  uVar6 = 0;
  memset(&local_d8f8,0,0xd8c8);
  if (1 < argc) {
    iVar5 = 1;
    local_f110 = (_func__Bool_state_ptr *)0x0;
    local_f100 = (code *)0x0;
    local_f108 = (rnndeccolors *)0x0;
    local_f118 = (char *)0x0;
    do {
      pcVar2 = argv[iVar5];
      if (*pcVar2 != '-') goto switchD_0010299a_caseD_6e;
      iVar4 = iVar5;
      switch(pcVar2[1]) {
      case 'm':
        if ((pcVar2[2] != '\0') || (iVar4 = iVar5 + 1, argc <= iVar4))
        goto switchD_0010299a_caseD_6e;
        pcVar2 = argv[iVar4];
        iVar5 = strncasecmp(pcVar2,"NV",2);
        if (iVar5 == 0) {
          pcVar2 = pcVar2 + 2;
        }
        uVar1 = strtoul(pcVar2,(char **)0x0,0x10);
        local_d8f8.chipset = (uint32_t)uVar1;
        break;
      case 'n':
      case 'p':
      case 'q':
      case 's':
      case 't':
      case 'u':
      case 'w':
        goto switchD_0010299a_caseD_6e;
      case 'o':
        if (((pcVar2[2] != '\0') || (iVar4 = iVar5 + 2, argc <= iVar4)) || (uVar6 == 0x100))
        goto switchD_0010299a_caseD_6e;
        uVar1 = strtoul(argv[(long)iVar5 + 1],(char **)0x0,0x10);
        auStack_f0f8[(long)(int)uVar6 * 6] = (uint32_t)uVar1;
        uVar1 = strtoul(argv[iVar4],(char **)0x0,0x10);
        auStack_f0f8[(long)(int)uVar6 * 6 + 1] = (uint32_t)uVar1;
        uVar6 = uVar6 + 1;
        break;
      case 'r':
        if ((pcVar2[2] != '\0') || (iVar4 = iVar5 + 1, argc <= iVar4))
        goto switchD_0010299a_caseD_6e;
        local_d8f8.op.parse = parse_renouveau;
        local_f118 = argv[iVar4];
        local_f110 = parse_renouveau;
        break;
      case 'v':
        if ((pcVar2[2] != '\0') || (iVar4 = iVar5 + 2, argc <= iVar4))
        goto switchD_0010299a_caseD_6e;
        local_d8f8.op.parse = parse_valgrind;
        lVar7 = strtol(argv[(long)iVar5 + 1],(char **)0x0,10);
        local_d8f8.filter.map = (int)lVar7;
        local_f118 = argv[iVar4];
        local_f110 = parse_valgrind;
        break;
      case 'x':
        if (pcVar2[2] != '\0') goto switchD_0010299a_caseD_6e;
        local_d8f8.op.flush = flush_raw;
        local_f100 = flush_raw;
        break;
      default:
        if ((pcVar2[1] != 'c') || (pcVar2[2] != '\0')) goto switchD_0010299a_caseD_6e;
        local_d8f8.colors = &rnndec_colorsterm;
        local_f108 = &rnndec_colorsterm;
      }
      iVar5 = iVar4 + 1;
    } while (iVar5 < argc);
    if (local_f118 != (char *)0x0) {
      if (local_f108 == (rnndeccolors *)0x0) {
        local_d8f8.colors = &rnndec_colorsnull;
      }
      if (local_f100 == (code *)0x0) {
        local_d8f8.op.flush = flush_dma;
      }
      local_d8f8.filter.addr1 = 0xffffffff;
      __stream = fopen(local_f118,"r");
      if (__stream != (FILE *)0x0) {
        rnn_init();
        db = rnn_newdb();
        local_d8f8.db = db;
        rnn_parsefile(db,"nv_objects.xml");
        rnn_prepdb(db);
        local_d8f8.dom = rnn_finddomain(db,"NV01_SUBCHAN");
        if (0 < (int)uVar6) {
          lVar7 = 0;
          do {
            add_object(&local_d8f8,*(uint32_t *)((long)auStack_f0f8 + lVar7),
                       *(uint32_t *)((long)auStack_f0f8 + lVar7 + 4));
            lVar7 = lVar7 + 0x18;
            local_f110 = local_d8f8.op.parse;
          } while ((ulong)uVar6 * 0x18 != lVar7);
        }
        if (local_f110 == parse_renouveau) {
          pcVar2 = dirname(local_f118);
          parse_renouveau_chipset(&local_d8f8,pcVar2);
          parse_renouveau_objects(&local_d8f8,pcVar2);
          parse_renouveau_startup(&local_d8f8,pcVar2);
        }
        dedma(&local_d8f8,(FILE *)__stream,false);
        fclose(__stream);
        free(local_d8f8.parse.buf);
        return 0;
      }
      perror(*argv);
      piVar3 = __errno_location();
      return *piVar3;
    }
  }
switchD_0010299a_caseD_6e:
  main_cold_1();
  return 0x16;
}

Assistant:

int
main(int argc, char *argv[])
{
	struct state s = { };
	struct obj obj[MAX_OBJECTS];
	int nobj = 0;
	char *path = NULL;
	FILE *f;
	int i;

	/* parse the command line */
	if (!configure(&s, argc, argv, &path, obj, &nobj))
		return EINVAL;

	/* open the input */
	f = fopen(path, "r");
	if (!f) {
		perror(argv[0]);
		return errno;
	}

	/* set up an rnn context */
	rnn_init();
	s.db = rnn_newdb();
	rnn_parsefile(s.db, "nv_objects.xml");
	rnn_prepdb(s.db);
	s.dom = rnn_finddomain(s.db, "NV01_SUBCHAN");

	/* insert objects specified in the command line */
	for (i = 0; i < nobj; i++)
		add_object(&s, obj[i].handle, obj[i].class);

	if (s.op.parse == parse_renouveau) {
		path = dirname(path);
		parse_renouveau_chipset(&s, path);
		parse_renouveau_objects(&s, path);
		parse_renouveau_startup(&s, path);
	}

	/* do it */
	dedma(&s, f, false);

	/* clean up */
	fclose(f);
	free(s.parse.buf);

	return 0;
}